

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

int __thiscall ON_Xform::Compare(ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  double *b;
  double *a;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (0x7f < uVar3) {
      return 0;
    }
    dVar1 = *(double *)((long)this->m_xform[0] + uVar3);
    dVar2 = *(double *)((long)rhs->m_xform[0] + uVar3);
    if (dVar1 < dVar2) {
      return -1;
    }
    if (dVar2 < dVar1) {
      return 1;
    }
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      if (!NAN(dVar1)) {
        return -1;
      }
      if (!NAN(dVar2)) {
        return 1;
      }
    }
    uVar3 = uVar3 + 8;
  } while( true );
}

Assistant:

int ON_Xform::Compare( const ON_Xform& rhs ) const
{
  const double* a = &m_xform[0][0];
  const double* b = &rhs.m_xform[0][0];
  const double* a16 = a + 16;
  while ( a < a16 )
  {
    const double x = *a++;
    const double y = *b++;
    if ( x < y )
      return -1;
    if ( x > y )
      return 1;
    if (x == y)
      continue;

    if (!(x == x))
    {
      // x is a nan
      if (!(y == y))
        continue; // x and y are nans
      return 1; // x is a nan and y is not.
    }

    // y is a nan and x is not a nan.
    return -1;
  }
  return 0;
}